

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Totals * __thiscall
Catch::RunContext::runTest(Totals *__return_storage_ptr__,RunContext *this,TestCase *testCase)

{
  Option<Catch::SectionTracking::TestCaseTracker> *this_00;
  size_t sVar1;
  size_t sVar2;
  IStreamingReporter *pIVar3;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  IMutableContext *pIVar7;
  size_t sVar8;
  size_t sVar9;
  string redirectedCerr;
  string redirectedCout;
  TestCaseInfo testInfo;
  string local_2a0;
  string local_280;
  TestCaseInfo local_260;
  undefined1 local_180 [48];
  undefined1 local_150 [24];
  _Alloc_hider local_138;
  undefined1 local_130 [16];
  undefined8 local_120;
  bool local_118;
  
  sVar1 = (this->m_totals).assertions.passed;
  sVar2 = (this->m_totals).assertions.failed;
  sVar8 = (this->m_totals).testCases.passed;
  sVar9 = (this->m_totals).testCases.failed;
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  local_280._M_string_length = 0;
  local_280.field_2._M_local_buf[0] = '\0';
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  local_2a0._M_string_length = 0;
  local_2a0.field_2._M_local_buf[0] = '\0';
  TestCaseInfo::TestCaseInfo(&local_260,&testCase->super_TestCaseInfo);
  pIVar3 = (this->m_reporter).m_p;
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[8])(pIVar3,&local_260);
  this->m_activeTestCase = testCase;
  local_180._0_8_ = local_180 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_180,local_260.name._M_dataplus._M_p,
             local_260.name._M_dataplus._M_p + local_260.name._M_string_length);
  local_150._16_8_ = local_150;
  local_180._32_4_ = NotStarted;
  local_150._0_4_ = _S_red;
  local_150._8_8_ = (_Base_ptr)0x0;
  local_130 = (undefined1  [16])0x0;
  local_118 = false;
  this_00 = &this->m_testCaseTracker;
  local_138._M_p = (pointer)local_150._16_8_;
  local_120 = (TestCaseTracker *)local_180;
  Option<Catch::SectionTracking::TestCaseTracker>::operator=(this_00,(TestCaseTracker *)local_180);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>_>_>
               *)(local_180 + 0x28));
  if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
    operator_delete((void *)local_180._0_8_);
  }
LAB_0013f524:
  do {
    runCurrentTest(this,&local_280,&local_2a0);
    if ((this_00->nullableValue->m_testCase).m_runState != Completed) {
      sVar4 = (this->m_totals).assertions.failed;
      iVar6 = (*(((this->m_config).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[10])();
      if (sVar4 != (long)iVar6) goto LAB_0013f524;
    }
    pIVar7 = getCurrentMutableContext();
    iVar6 = (*(pIVar7->super_IContext)._vptr_IContext[5])(pIVar7);
    if ((char)iVar6 == '\0') goto LAB_0013f583;
    sVar4 = (this->m_totals).assertions.failed;
    iVar6 = (*(((this->m_config).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[10])();
    if (sVar4 == (long)iVar6) {
LAB_0013f583:
      sVar4 = (this->m_totals).assertions.failed;
      (__return_storage_ptr__->assertions).passed = (this->m_totals).assertions.passed - sVar1;
      (__return_storage_ptr__->assertions).failed = sVar4 - sVar2;
      sVar8 = (this->m_totals).testCases.passed - sVar8;
      sVar9 = (this->m_totals).testCases.failed - sVar9;
      sVar1 = (this->m_totals).testCases.passed;
      sVar5 = (this->m_totals).testCases.failed;
      (__return_storage_ptr__->testCases).passed = sVar8;
      (__return_storage_ptr__->testCases).failed = sVar9;
      if (sVar4 == sVar2) {
        sVar9 = sVar8;
      }
      (&(__return_storage_ptr__->testCases).passed)[sVar4 != sVar2] = sVar9 + 1;
      sVar2 = (__return_storage_ptr__->testCases).failed;
      (this->m_totals).testCases.passed = (__return_storage_ptr__->testCases).passed + sVar1;
      (this->m_totals).testCases.failed = sVar2 + sVar5;
      pIVar3 = (this->m_reporter).m_p;
      iVar6 = (*(((this->m_config).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[10])();
      TestCaseStats::TestCaseStats
                ((TestCaseStats *)local_180,&local_260,__return_storage_ptr__,&local_280,&local_2a0,
                 sVar4 == (long)iVar6);
      (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xd])(pIVar3,local_180);
      TestCaseStats::~TestCaseStats((TestCaseStats *)local_180);
      this->m_activeTestCase = (TestCase *)0x0;
      Option<Catch::SectionTracking::TestCaseTracker>::reset(this_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260.lineInfo.file._M_dataplus._M_p != &local_260.lineInfo.file.field_2) {
        operator_delete(local_260.lineInfo.file._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260.tagsAsString._M_dataplus._M_p != &local_260.tagsAsString.field_2) {
        operator_delete(local_260.tagsAsString._M_dataplus._M_p);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_260.tags._M_t);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260.description._M_dataplus._M_p != &local_260.description.field_2) {
        operator_delete(local_260.description._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260.className._M_dataplus._M_p != &local_260.className.field_2) {
        operator_delete(local_260.className._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260.name._M_dataplus._M_p != &local_260.name.field_2) {
        operator_delete(local_260.name._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p);
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Totals runTest( TestCase const& testCase ) {
            Totals prevTotals = m_totals;

            std::string redirectedCout;
            std::string redirectedCerr;

            TestCaseInfo testInfo = testCase.getTestCaseInfo();

            m_reporter->testCaseStarting( testInfo );

            m_activeTestCase = &testCase;
            m_testCaseTracker = TestCaseTracker( testInfo.name );

            do {
                do {
                    runCurrentTest( redirectedCout, redirectedCerr );
                }
                while( !m_testCaseTracker->isCompleted() && !aborting() );
            }
            while( getCurrentContext().advanceGeneratorsForCurrentTest() && !aborting() );

            Totals deltaTotals = m_totals.delta( prevTotals );
            m_totals.testCases += deltaTotals.testCases;
            m_reporter->testCaseEnded( TestCaseStats(   testInfo,
                                                        deltaTotals,
                                                        redirectedCout,
                                                        redirectedCerr,
                                                        aborting() ) );

            m_activeTestCase = NULL;
            m_testCaseTracker.reset();

            return deltaTotals;
        }